

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O2

int IPdr_ManSolveInt(Pdr_Man_t *p,int fCheckClauses,int fPushClauses)

{
  int *piVar1;
  abctime *paVar2;
  Aig_Man_t *pAVar3;
  _func_int_int_Abc_Cex_t_ptr *p_Var4;
  Pdr_Man_t *pPVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  abctime aVar10;
  abctime aVar11;
  long lVar12;
  void *pvVar13;
  Vec_Int_t *pVVar14;
  void *pvVar15;
  Abc_Cex_t *pAVar16;
  Pdr_Par_t *pPVar17;
  abctime aVar18;
  Vec_Ptr_t *pVVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  Pdr_Man_t *pPVar25;
  Pdr_Man_t *pPVar26;
  Vec_Vec_t *p_00;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  Pdr_Set_t *pCube;
  uint local_5c;
  ulong local_58;
  Pdr_Man_t *local_50;
  int local_44;
  int local_40;
  uint local_3c;
  abctime local_38;
  
  pCube = (Pdr_Set_t *)0x0;
  uVar27 = p->pAig->nTruePos;
  local_58 = (ulong)uVar27;
  if (1 < uVar27) {
    local_58 = 0;
    for (uVar27 = uVar27 - 1; uVar27 != 0; uVar27 = uVar27 / 10) {
      local_58 = (ulong)((int)local_58 + 1);
    }
  }
  pPVar25 = p;
  aVar10 = Abc_Clock();
  pPVar17 = p->pPars;
  iVar7 = pPVar17->nTimeOut;
  if ((long)iVar7 == 0) {
    lVar12 = 0;
  }
  else {
    aVar11 = Abc_Clock();
    lVar12 = aVar11 + (long)iVar7 * 1000000;
    pPVar17 = p->pPars;
  }
  iVar7 = (int)pPVar25;
  p->timeToStop = lVar12;
  local_50 = p;
  if (pPVar17->fSolveAll != 0) {
    iVar30 = 0;
    while( true ) {
      pPVar26 = local_50;
      iVar7 = (int)pPVar25;
      if (local_50->pAig->nTruePos <= iVar30) break;
      pPVar25 = (Pdr_Man_t *)local_50->pAig->vCos;
      pvVar13 = Vec_PtrEntry((Vec_Ptr_t *)pPVar25,iVar30);
      pPVar5 = local_50;
      if (*(ulong *)((long)pvVar13 + 8) == ((ulong)pPVar26->pAig->pConst1 ^ 1)) {
        pPVar25 = (Pdr_Man_t *)local_50->pPars->vOutMap;
        Vec_IntWriteEntry((Vec_Int_t *)pPVar25,iVar30,1);
        pPVar17 = pPVar5->pPars;
        piVar1 = &pPVar17->nProveOuts;
        *piVar1 = *piVar1 + 1;
        if (pPVar17->fUseBridge != 0) {
          pPVar25 = _stdout;
          Gia_ManToBridgeResult((FILE *)_stdout,1,(Abc_Cex_t *)0x0,iVar30);
        }
      }
      iVar30 = iVar30 + 1;
    }
  }
  pPVar25 = local_50;
  aVar11 = Abc_Clock();
  pPVar17 = pPVar25->pPars;
  pPVar17->timeLastSolved = aVar11;
  uVar27 = pPVar25->vClauses->nSize;
  if (uVar27 == 0) {
    uVar28 = 0;
    Pdr_ManCreateSolver(pPVar25,0);
  }
  else {
    if (fCheckClauses != 0) {
      if (pPVar17->fVerbose != 0) {
        Abc_Print(iVar7,"IPDR: Checking the reloaded length-%d trace...",(ulong)uVar27);
      }
      pPVar26 = pPVar25;
      IPdr_ManCheckClauses(pPVar25);
      iVar7 = (int)pPVar26;
      pPVar17 = pPVar25->pPars;
      if (pPVar17->fVerbose != 0) {
        Abc_Print(iVar7," Passed!\n");
        pPVar17 = pPVar25->pPars;
      }
    }
    uVar20 = uVar27 - 1;
    uVar28 = (ulong)uVar20;
    if (fPushClauses != 0) {
      uVar6 = 1;
      if (1 < (int)uVar20) {
        uVar6 = uVar20;
      }
      pPVar25->iUseFrame = uVar6;
      if (pPVar17->fVerbose != 0) {
        Abc_Print(iVar7,"IPDR: Pushing the reloaded clauses. Before:\n");
        aVar11 = Abc_Clock();
        Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
      }
      pPVar26 = pPVar25;
      iVar7 = Pdr_ManPushClauses(pPVar25);
      if (pPVar25->pPars->fVerbose != 0) {
        Abc_Print((int)pPVar26,"IPDR: Finished pushing. After:\n");
        aVar11 = Abc_Clock();
        Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
      }
      if (iVar7 != 0) {
        Pdr_ManReportInvariant(pPVar25);
        Pdr_ManVerifyInvariant(pPVar25);
        return 1;
      }
      pPVar17 = pPVar25->pPars;
    }
    if (((pPVar17->fUseAbs != 0) && (1 < (int)uVar27)) && (pPVar25->vAbsFlops == (Vec_Int_t *)0x0))
    {
      pVVar14 = Vec_IntStart(pPVar25->pAig->nRegs);
      pPVar25->vAbsFlops = pVVar14;
      pVVar14 = Vec_IntStartFull(pPVar25->pAig->nRegs);
      pPVar25->vMapFf2Ppi = pVVar14;
      pVVar14 = Vec_IntAlloc(100);
      pPVar25->vMapPpi2Ff = pVVar14;
      IPdr_ManRestoreAbsFlops(pPVar25);
    }
  }
  local_38 = 0;
  do {
    local_5c = (uint)uVar28;
    local_3c = 1;
    if (1 < (int)local_5c) {
      local_3c = local_5c;
    }
    do {
      uVar27 = (uint)uVar28;
      if (((pPVar25->pPars->fUseAbs != 0) && (pPVar25->vAbsFlops == (Vec_Int_t *)0x0)) &&
         (uVar27 == 1)) {
        pVVar14 = Vec_IntStart(pPVar25->pAig->nRegs);
        pPVar25->vAbsFlops = pVVar14;
        pVVar14 = Vec_IntStartFull(pPVar25->pAig->nRegs);
        pPVar25->vMapFf2Ppi = pVVar14;
        pVVar14 = Vec_IntAlloc(100);
        pPVar25->vMapPpi2Ff = pVVar14;
      }
      pPVar25->nFrames = uVar27;
      if (uVar27 != pPVar25->vSolvers->nSize - 1U) {
        __assert_fail("iFrame == Vec_PtrSize(p->vSolvers)-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                      ,0x1d1,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
      }
      pPVar25->iUseFrame = local_3c;
      iVar7 = 0;
      while( true ) {
        pPVar25->iOutCur = iVar7;
        iVar30 = pPVar25->pAig->nTruePos;
        if (iVar30 <= iVar7) break;
        pvVar13 = Vec_PtrEntry(pPVar25->pAig->vCos,iVar7);
        if (((pPVar25->vCexes == (Vec_Ptr_t *)0x0) ||
            (pvVar15 = Vec_PtrEntry(pPVar25->vCexes,pPVar25->iOutCur), pvVar15 == (void *)0x0)) &&
           ((paVar2 = pPVar25->pTime4Outs, paVar2 == (abctime *)0x0 ||
            (paVar2[pPVar25->iOutCur] != 0)))) {
          pAVar3 = pPVar25->pAig;
          pPVar26 = (Pdr_Man_t *)((ulong)pAVar3->pConst1 ^ 1);
          if (*(Pdr_Man_t **)((long)pvVar13 + 8) != pPVar26) {
            if (*(Pdr_Man_t **)((long)pvVar13 + 8) != (Pdr_Man_t *)pAVar3->pConst1) {
              if (paVar2 != (abctime *)0x0) {
                if (paVar2[pPVar25->iOutCur] < 1) {
                  __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                ,0x202,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                }
                local_38 = Abc_Clock();
                lVar12 = pPVar25->pTime4Outs[pPVar25->iOutCur];
                aVar11 = Abc_Clock();
                pPVar25->timeToStopOne = aVar11 + lVar12;
              }
              do {
                while( true ) {
                  iVar29 = (int)pPVar26;
                  pPVar17 = pPVar25->pPars;
                  if ((pPVar17->nTimeOutGap != 0) && (pPVar17->timeLastSolved != 0)) {
                    aVar11 = Abc_Clock();
                    pPVar17 = pPVar25->pPars;
                    if ((long)pPVar17->nTimeOutGap * 1000000 + pPVar17->timeLastSolved < aVar11)
                    goto LAB_0073337f;
                  }
                  pPVar26 = pPVar25;
                  iVar8 = Pdr_ManCheckCube(pPVar25,uVar27,(Pdr_Set_t *)0x0,&pCube,
                                           pPVar17->nConfLimit,0,1);
                  iVar29 = (int)pPVar26;
                  if (iVar8 != 0) break;
                  pPVar26 = pPVar25;
                  iVar9 = Pdr_ManBlockCube(pPVar25,pCube);
                  iVar29 = (int)pPVar26;
                  pPVar17 = pPVar25->pPars;
                  iVar8 = pPVar17->fVerbose;
                  if (iVar9 == 0) {
                    if ((iVar8 != 0) && (pPVar17->fUseAbs == 0)) {
                      iVar29 = pPVar17->fSolveAll;
                      aVar11 = Abc_Clock();
                      Pdr_ManPrintProgress(pPVar25,(uint)(iVar29 == 0),aVar11 - aVar10);
                      pPVar17 = pPVar25->pPars;
                    }
                    pPVar17->iFrame = uVar27;
                    if (pPVar17->fSolveAll == 0) {
                      aVar11 = Abc_Clock();
                      pAVar16 = Pdr_ManDeriveCexAbs(pPVar25);
                      aVar18 = Abc_Clock();
                      pPVar25->tAbs = pPVar25->tAbs + (aVar18 - aVar11);
                      if (pAVar16 != (Abc_Cex_t *)0x0) {
                        pPVar25->pAig->pSeqModel = pAVar16;
                        pPVar17 = pPVar25->pPars;
                        if (pPVar17->fVerbose == 0) {
                          return 0;
                        }
                        if (pPVar17->fUseAbs != 0) {
                          iVar7 = pPVar17->fSolveAll;
                          aVar11 = Abc_Clock();
                          Pdr_ManPrintProgress(pPVar25,(uint)(iVar7 == 0),aVar11 - aVar10);
                          return 0;
                        }
                        return 0;
                      }
                      if (pPVar25->pPars->fUseAbs == 0) {
                        __assert_fail("p->pPars->fUseAbs",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                      ,0x252,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                      }
                      Pdr_QueueClean(pPVar25);
                      pCube = (Pdr_Set_t *)0x0;
                      uVar28 = (ulong)local_5c;
                      goto LAB_00733133;
                    }
                    pPVar17->nFailOuts = pPVar17->nFailOuts + 1;
                    if ((pPVar17->fUseBridge != 0) ||
                       (pAVar16 = (Abc_Cex_t *)0x1, pPVar17->fStoreCex != 0)) {
                      pAVar16 = Pdr_ManDeriveCex(pPVar25);
                      pPVar17 = pPVar25->pPars;
                    }
                    if (pPVar17->vOutMap != (Vec_Int_t *)0x0) {
                      Vec_IntWriteEntry(pPVar17->vOutMap,pPVar25->iOutCur,0);
                    }
                    pvVar13 = Vec_PtrEntry(pPVar25->vCexes,pPVar25->iOutCur);
                    if (pvVar13 != (void *)0x0) {
                      __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                    ,0x261,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                    }
                    if (pPVar25->pPars->fUseBridge != 0) {
                      Gia_ManToBridgeResult((FILE *)_stdout,0,pAVar16,pAVar16->iPo);
                    }
                    Vec_PtrWriteEntry(pPVar25->vCexes,pPVar25->iOutCur,pAVar16);
                    pPVar17 = pPVar25->pPars;
                    p_Var4 = pPVar17->pFuncOnFail;
                    if (p_Var4 != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
                      iVar7 = pPVar25->iOutCur;
                      if (pPVar17->fStoreCex == 0) {
                        pAVar16 = (Abc_Cex_t *)0x0;
                      }
                      else {
                        pAVar16 = (Abc_Cex_t *)Vec_PtrEntry(pPVar25->vCexes,iVar7);
                      }
                      iVar30 = (*p_Var4)(iVar7,pAVar16);
                      pPVar17 = pPVar25->pPars;
                      if (iVar30 != 0) {
                        if (pPVar17->fVerbose != 0) {
                          aVar11 = Abc_Clock();
                          pPVar26 = pPVar25;
                          Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
                          iVar7 = (int)pPVar26;
                          pPVar17 = pPVar25->pPars;
                        }
                        if (pPVar17->fSilent == 0) {
                          Abc_Print(iVar7,"Quitting due to callback on fail in frame %d.\n",uVar28);
                          pPVar17 = pPVar25->pPars;
                        }
                        pPVar17->iFrame = uVar27;
                        return -1;
                      }
                    }
                    if (pPVar17->fNotVerbose == 0) {
                      Abc_Print(pPVar17->nFailOuts,
                                "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n"
                                ,local_58,(ulong)(uint)pPVar25->iOutCur,uVar28,uVar28,local_58,
                                (ulong)(uint)pPVar17->nFailOuts,local_58,
                                (ulong)(uint)pPVar25->pAig->nTruePos);
                      pPVar17 = pPVar25->pPars;
                    }
                    if (pPVar17->nFailOuts == pPVar25->pAig->nTruePos) {
                      return 0;
                    }
                    goto LAB_0073302a;
                  }
                  if (iVar9 == -1) goto joined_r0x00732de6;
                  if (iVar8 != 0) {
                    aVar11 = Abc_Clock();
                    pPVar26 = pPVar25;
                    Pdr_ManPrintProgress(pPVar25,0,aVar11 - aVar10);
                  }
                }
                if (iVar8 == 1) goto LAB_00733038;
              } while (iVar8 != -1);
              iVar8 = pPVar25->pPars->fVerbose;
joined_r0x00732de6:
              if (iVar8 != 0) {
                aVar11 = Abc_Clock();
                pPVar26 = pPVar25;
                Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
                iVar29 = (int)pPVar26;
              }
              if (pPVar25->timeToStop == 0) {
                pPVar17 = pPVar25->pPars;
              }
              else {
                aVar11 = Abc_Clock();
                pPVar17 = pPVar25->pPars;
                if (pPVar25->timeToStop < aVar11) goto LAB_0073352d;
              }
              if ((pPVar17->nTimeOutGap != 0) && (pPVar17->timeLastSolved != 0)) {
                aVar11 = Abc_Clock();
                pPVar17 = pPVar25->pPars;
                uVar22 = (ulong)pPVar17->nTimeOutGap;
                if ((long)(uVar22 * 1000000 + pPVar17->timeLastSolved) < aVar11) {
                  pcVar24 = "Reached gap timeout (%d seconds) in frame %d.\n";
                  goto LAB_00733537;
                }
              }
              if (pPVar25->timeToStopOne != 0) {
                aVar11 = Abc_Clock();
                if (pPVar25->timeToStopOne < aVar11) {
LAB_0073302a:
                  Pdr_QueueClean(pPVar25);
                  pCube = (Pdr_Set_t *)0x0;
LAB_00733038:
                  if (pPVar25->pTime4Outs != (abctime *)0x0) {
                    aVar11 = Abc_Clock();
                    iVar7 = pPVar25->iOutCur;
                    lVar12 = pPVar25->pTime4Outs[iVar7];
                    if (lVar12 < 1) {
                      __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                    ,0x280,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                    }
                    lVar23 = lVar12 - (aVar11 - local_38);
                    if (lVar23 == 0 || lVar12 < aVar11 - local_38) {
                      lVar23 = 0;
                    }
                    pPVar25->pTime4Outs[iVar7] = lVar23;
                    if ((lVar23 == 0) &&
                       (pvVar13 = Vec_PtrEntry(pPVar25->vCexes,iVar7), pvVar13 == (void *)0x0)) {
                      pPVar17 = pPVar25->pPars;
                      pPVar17->nDropOuts = pPVar17->nDropOuts + 1;
                      pVVar14 = pPVar17->vOutMap;
                      if (pVVar14 != (Vec_Int_t *)0x0) {
                        Vec_IntWriteEntry(pVVar14,pPVar25->iOutCur,-1);
                        pPVar17 = pPVar25->pPars;
                      }
                      if (pPVar17->fNotVerbose == 0) {
                        Abc_Print((int)pVVar14,"Timing out on output %*d in frame %d.\n",local_58,
                                  (ulong)(uint)pPVar25->iOutCur,uVar28);
                      }
                    }
                    pPVar25->timeToStopOne = 0;
                  }
                  goto LAB_007330d9;
                }
                pPVar17 = pPVar25->pPars;
              }
              uVar22 = (ulong)(uint)pPVar17->nConfLimit;
              if (pPVar17->nConfLimit == 0) {
                if (pPVar17->fVerbose != 0) {
                  Abc_Print(iVar29,"Computation cancelled by the callback in frame %d.\n",uVar28);
                }
                goto LAB_00733541;
              }
              pcVar24 = "Reached conflict limit (%d) in frame %d.\n";
              goto LAB_00733537;
            }
            pPVar17 = pPVar25->pPars;
            if (pPVar17->fSolveAll == 0) {
              pAVar16 = Abc_CexMakeTriv(pAVar3->nRegs,pAVar3->nTruePis,pAVar3->nTruePos,
                                        uVar27 * pAVar3->nTruePos + pPVar25->iOutCur);
              pPVar25->pAig->pSeqModel = pAVar16;
              return 0;
            }
            if ((pPVar17->fUseBridge != 0) || (pAVar16 = (Abc_Cex_t *)0x1, pPVar17->fStoreCex != 0))
            {
              pAVar16 = Abc_CexMakeTriv(pAVar3->nRegs,pAVar3->nTruePis,pAVar3->nTruePos,
                                        pAVar3->nTruePos * uVar27 + pPVar25->iOutCur);
              pPVar17 = pPVar25->pPars;
            }
            pPVar17->nFailOuts = pPVar17->nFailOuts + 1;
            uVar20 = pPVar25->iOutCur;
            if (pPVar17->vOutMap != (Vec_Int_t *)0x0) {
              Vec_IntWriteEntry(pPVar17->vOutMap,uVar20,0);
              pPVar17 = pPVar25->pPars;
              uVar20 = pPVar25->iOutCur;
            }
            if (pPVar17->fNotVerbose == 0) {
              Abc_Print(pPVar17->nFailOuts,
                        "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n"
                        ,local_58,(ulong)uVar20,uVar28,local_58 & 0xffffffff,
                        (ulong)(uint)pPVar17->nFailOuts,local_58,
                        (ulong)(uint)pPVar25->pAig->nTruePos);
              uVar20 = pPVar25->iOutCur;
            }
            pvVar13 = Vec_PtrEntry(pPVar25->vCexes,uVar20);
            if (pvVar13 != (void *)0x0) {
              __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                            ,0x1ed,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
            }
            if (pPVar25->pPars->fUseBridge != 0) {
              Gia_ManToBridgeResult((FILE *)_stdout,0,pAVar16,pAVar16->iPo);
            }
            Vec_PtrWriteEntry(pPVar25->vCexes,pPVar25->iOutCur,pAVar16);
            pPVar17 = pPVar25->pPars;
            p_Var4 = pPVar17->pFuncOnFail;
            if (p_Var4 != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
              iVar29 = pPVar25->iOutCur;
              if (pPVar17->fStoreCex == 0) {
                pAVar16 = (Abc_Cex_t *)0x0;
              }
              else {
                pAVar16 = (Abc_Cex_t *)Vec_PtrEntry(pPVar25->vCexes,iVar29);
              }
              iVar7 = (*p_Var4)(iVar29,pAVar16);
              pPVar17 = pPVar25->pPars;
              if (iVar7 != 0) {
                if (pPVar17->fVerbose != 0) {
                  aVar11 = Abc_Clock();
                  pPVar26 = pPVar25;
                  Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
                  iVar29 = (int)pPVar26;
                  pPVar17 = pPVar25->pPars;
                }
                if (pPVar17->fSilent != 0) goto LAB_007333be;
                pcVar24 = "Quitting due to callback on fail in frame %d.\n";
                goto LAB_0073345b;
              }
            }
            if (pPVar17->nDropOuts + pPVar17->nFailOuts == pPVar25->pAig->nTruePos) {
              return -(uint)(pPVar17->nFailOuts == 0);
            }
            aVar11 = Abc_Clock();
            pPVar25->pPars->timeLastSolved = aVar11;
          }
        }
LAB_007330d9:
        iVar7 = pPVar25->iOutCur + 1;
      }
LAB_00733133:
      pPVar17 = pPVar25->pPars;
      iVar29 = iVar30;
      local_40 = iVar7;
      if ((pPVar17->fUseAbs != 0) &&
         (pVVar14 = pPVar25->vAbsFlops, pVVar14 != (Vec_Int_t *)0x0 && iVar30 <= iVar7)) {
        uVar27 = pVVar14->nSize;
        local_44 = iVar30;
        Vec_IntGrow(pVVar14,uVar27);
        uVar22 = 0;
        if (0 < (int)uVar27) {
          uVar22 = (ulong)uVar27;
        }
        for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
          pVVar14->pArray[uVar21] = 0;
        }
        pVVar14->nSize = uVar27;
        for (iVar29 = 0; p_00 = pPVar25->vClauses, iVar29 < p_00->nSize; iVar29 = iVar29 + 1) {
          for (iVar8 = 0; pVVar19 = Vec_VecEntry(p_00,iVar29), iVar8 < pVVar19->nSize;
              iVar8 = iVar8 + 1) {
            pVVar19 = Vec_VecEntry(pPVar25->vClauses,iVar29);
            pvVar13 = Vec_PtrEntry(pVVar19,iVar8);
            for (lVar12 = 0; lVar12 < *(int *)((long)pvVar13 + 0x10); lVar12 = lVar12 + 1) {
              pVVar14 = local_50->vAbsFlops;
              iVar9 = Abc_Lit2Var(*(int *)((long)pvVar13 + lVar12 * 4 + 0x14));
              Vec_IntWriteEntry(pVVar14,iVar9,1);
            }
            p_00 = local_50->vClauses;
            pPVar25 = local_50;
          }
          uVar28 = (ulong)local_5c;
        }
        pPVar17 = pPVar25->pPars;
        iVar29 = local_44;
      }
      if (pPVar17->fVerbose != 0) {
        aVar11 = Abc_Clock();
        Pdr_ManPrintProgress(pPVar25,(uint)(iVar30 <= iVar7),aVar11 - aVar10);
      }
    } while (local_40 < iVar29);
    pPVar25->nQueLim = pPVar25->pPars->nRestLimit;
    if (pCube != (Pdr_Set_t *)0x0) {
      __assert_fail("pCube == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                    ,0x2a8,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
    }
    Pdr_ManSetPropertyOutput(pPVar25,(int)uVar28);
    uVar27 = (int)uVar28 + 1;
    uVar28 = (ulong)uVar27;
    Pdr_ManCreateSolver(pPVar25,uVar27);
    pPVar26 = pPVar25;
    iVar30 = Pdr_ManPushClauses(pPVar25);
    iVar29 = (int)pPVar26;
    pPVar17 = pPVar25->pPars;
    iVar7 = pPVar17->fVerbose;
    if (iVar30 != 0) {
      if (iVar30 != -1) {
        if (iVar7 != 0) {
          aVar11 = Abc_Clock();
          Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
          pPVar17 = pPVar25->pPars;
        }
        if (pPVar17->fSilent == 0) {
          Pdr_ManReportInvariant(pPVar25);
          pPVar17 = pPVar25->pPars;
          if (pPVar17->fSilent == 0) {
            Pdr_ManVerifyInvariant(pPVar25);
            pPVar17 = pPVar25->pPars;
          }
        }
        pPVar17->iFrame = uVar27;
        iVar7 = pPVar25->pAig->nTruePos;
        iVar30 = iVar7 - (pPVar17->nFailOuts + pPVar17->nDropOuts);
        pPVar17->nProveOuts = iVar30;
        if (pPVar17->vOutMap != (Vec_Int_t *)0x0) {
          for (iVar30 = 0; pPVar17 = pPVar25->pPars, iVar30 < iVar7; iVar30 = iVar30 + 1) {
            iVar7 = Vec_IntEntry(pPVar17->vOutMap,iVar30);
            if ((iVar7 == -2) &&
               (Vec_IntWriteEntry(pPVar25->pPars->vOutMap,iVar30,1), pPVar25->pPars->fUseBridge != 0
               )) {
              Gia_ManToBridgeResult((FILE *)_stdout,1,(Abc_Cex_t *)0x0,iVar30);
            }
            iVar7 = pPVar25->pAig->nTruePos;
          }
          iVar30 = pPVar17->nProveOuts;
        }
        if (iVar30 != iVar7) {
          return -(uint)(pPVar17->nFailOuts < 1);
        }
        return 1;
      }
      if (iVar7 != 0) {
        aVar11 = Abc_Clock();
        pPVar26 = pPVar25;
        Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
        iVar29 = (int)pPVar26;
        pPVar17 = pPVar25->pPars;
      }
      if (pPVar17->fSilent != 0) goto LAB_00733541;
      if (pPVar25->timeToStop == 0) {
LAB_007336d2:
        uVar22 = (ulong)(uint)pPVar17->nConfLimit;
        pcVar24 = "Reached conflict limit (%d) in frame.\n";
      }
      else {
        aVar10 = Abc_Clock();
        pPVar17 = pPVar25->pPars;
        if (aVar10 <= pPVar25->timeToStop) goto LAB_007336d2;
LAB_0073352d:
        uVar22 = (ulong)(uint)pPVar17->nTimeOut;
        pcVar24 = "Reached timeout (%d seconds) in frame %d.\n";
      }
LAB_00733537:
      uVar27 = (uint)uVar28;
      Abc_Print(iVar29,pcVar24,uVar22,uVar28);
LAB_00733541:
      pPVar25->pPars->iFrame = uVar27;
      return -1;
    }
    if (iVar7 != 0) {
      aVar11 = Abc_Clock();
      pPVar26 = pPVar25;
      Pdr_ManPrintProgress(pPVar25,0,aVar11 - aVar10);
      iVar29 = (int)pPVar26;
      pPVar17 = pPVar25->pPars;
    }
    if (pPVar17->pFuncStop != (_func_int_int *)0x0) {
      iVar29 = pPVar17->RunId;
      iVar7 = (*pPVar17->pFuncStop)(iVar29);
      if (iVar7 != 0) goto LAB_00733541;
    }
    if (pPVar25->timeToStop != 0) {
      aVar11 = Abc_Clock();
      pPVar17 = pPVar25->pPars;
      if (aVar11 <= pPVar25->timeToStop) goto LAB_00733303;
      if (pPVar17->fVerbose != 0) {
        aVar11 = Abc_Clock();
        pPVar26 = pPVar25;
        Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
        iVar29 = (int)pPVar26;
        pPVar17 = pPVar25->pPars;
      }
      if (pPVar17->fSilent != 0) goto LAB_007333be;
      uVar20 = pPVar17->nTimeOut;
      pcVar24 = "Reached timeout (%d seconds) in frame %d.\n";
LAB_007333b0:
      uVar27 = (uint)uVar28;
      Abc_Print(iVar29,pcVar24,(ulong)uVar20,uVar28);
      goto LAB_007333ba;
    }
    pPVar17 = pPVar25->pPars;
LAB_00733303:
    if ((pPVar17->nTimeOutGap != 0) && (pPVar17->timeLastSolved != 0)) {
      aVar11 = Abc_Clock();
      pPVar17 = pPVar25->pPars;
      if ((long)pPVar17->nTimeOutGap * 1000000 + pPVar17->timeLastSolved < aVar11) {
LAB_0073337f:
        uVar27 = (uint)uVar28;
        if (pPVar17->fVerbose != 0) {
          aVar11 = Abc_Clock();
          pPVar26 = pPVar25;
          Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
          iVar29 = (int)pPVar26;
          pPVar17 = pPVar25->pPars;
        }
        if (pPVar17->fSilent == 0) {
          uVar20 = pPVar17->nTimeOutGap;
          pcVar24 = "Reached gap timeout (%d seconds) in frame %d.\n";
          goto LAB_007333b0;
        }
        goto LAB_007333be;
      }
    }
  } while ((pPVar17->nFrameMax == 0) || ((int)uVar27 < pPVar17->nFrameMax));
  if (pPVar17->fVerbose != 0) {
    aVar11 = Abc_Clock();
    pPVar26 = pPVar25;
    Pdr_ManPrintProgress(pPVar25,1,aVar11 - aVar10);
    iVar29 = (int)pPVar26;
    pPVar17 = pPVar25->pPars;
  }
  if (pPVar17->fSilent == 0) {
    uVar28 = (ulong)(uint)pPVar17->nFrameMax;
    pcVar24 = "Reached limit on the number of timeframes (%d).\n";
LAB_0073345b:
    Abc_Print(iVar29,pcVar24,uVar28);
LAB_007333ba:
    pPVar17 = pPVar25->pPars;
  }
LAB_007333be:
  pPVar17->iFrame = uVar27;
  return -1;
}

Assistant:

int IPdr_ManSolveInt( Pdr_Man_t * p, int fCheckClauses, int fPushClauses )
{
    int fPrintClauses = 0;
    Pdr_Set_t * pCube = NULL;
    Aig_Obj_t * pObj;
    Abc_Cex_t * pCexNew;
    int iFrame, RetValue = -1;
    int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
    abctime clkStart = Abc_Clock(), clkOne = 0;
    p->timeToStop = p->pPars->nTimeOut ? p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    // assert( Vec_PtrSize(p->vSolvers) == 0 );
    // in the multi-output mode, mark trivial POs (those fed by const0) as solved 
    if ( p->pPars->fSolveAll )
        Saig_ManForEachPo( p->pAig, pObj, iFrame )
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
            {
                Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                p->pPars->nProveOuts++;
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
            }
    // create the first timeframe
    p->pPars->timeLastSolved = Abc_Clock();

    if ( Vec_VecSize(p->vClauses) == 0 )
        Pdr_ManCreateSolver( p, (iFrame = 0) );
    else {
        iFrame = Vec_VecSize(p->vClauses) - 1;

        if ( fCheckClauses )
        {
            if ( p->pPars->fVerbose )
               Abc_Print( 1, "IPDR: Checking the reloaded length-%d trace...", iFrame + 1 ) ;
            IPdr_ManCheckClauses( p );
            if ( p->pPars->fVerbose )
               Abc_Print( 1, " Passed!\n" ) ;
        }

        if ( fPushClauses )
        {
            p->iUseFrame = Abc_MaxInt(iFrame, 1);

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Pushing the reloaded clauses. Before:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            RetValue = Pdr_ManPushClauses( p );

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Finished pushing. After:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            if ( RetValue ) 
            {
                Pdr_ManReportInvariant( p );
                Pdr_ManVerifyInvariant( p );
                return 1;
            }
        }

        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame >= 1 )
        {
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
            
            IPdr_ManRestoreAbsFlops( p );
        }
 
    }
    while ( 1 )
    {
        int fRefined = 0;
        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame == 1 )
        {
//            int i, Prio;
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
//            Vec_IntForEachEntry( p->vPrio, Prio, i )
//                if ( Prio >> p->nPrioShift  )
//                    Vec_IntWriteEntry( p->vAbsFlops, i, 1 );
        }
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Starting frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        p->nFrames = iFrame;
        assert( iFrame == Vec_PtrSize(p->vSolvers)-1 );
        p->iUseFrame = Abc_MaxInt(iFrame, 1);
        Saig_ManForEachPo( p->pAig, pObj, p->iOutCur )
        {
            // skip disproved outputs
            if ( p->vCexes && Vec_PtrEntry(p->vCexes, p->iOutCur) )
                continue;
            // skip output whose time has run out
            if ( p->pTime4Outs && p->pTime4Outs[p->iOutCur] == 0 )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst1(p->pAig) )
            {
                if ( !p->pPars->fSolveAll )
                {
                    pCexNew = Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur );
                    p->pAig->pSeqModel = pCexNew;
                    return 0; // SAT
                }
                pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur ) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                p->pPars->nFailOuts++;
                if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                if ( !p->pPars->fNotVerbose )
                Abc_Print( 1, "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n",
                    nOutDigits, p->iOutCur, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( p->pPars->nFailOuts + p->pPars->nDropOuts == Saig_ManPoNum(p->pAig) )
                    return p->pPars->nFailOuts ? 0 : -1; // SAT or UNDEC
                p->pPars->timeLastSolved = Abc_Clock();
                continue;
            }
            // try to solve this output
            if ( p->pTime4Outs )
            {
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                clkOne = Abc_Clock();
                p->timeToStopOne = p->pTime4Outs[p->iOutCur] + Abc_Clock();
            }
            while ( 1 )
            {
                if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                RetValue = Pdr_ManCheckCube( p, iFrame, NULL, &pCube, p->pPars->nConfLimit, 0, 1 );
                if ( RetValue == 1 )
                    break;
                if ( RetValue == -1 )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                        Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                    else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                    {
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    else if ( p->pPars->nConfLimit )
                        Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                    else if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( RetValue == 0 )
                {
                    RetValue = Pdr_ManBlockCube( p, pCube );
                    if ( RetValue == -1 )
                    {
                        if ( p->pPars->fVerbose )
                            Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                            Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                        else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                            Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                        else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                        {
                            Pdr_QueueClean( p );
                            pCube = NULL;
                            break; // keep solving
                        }
                        else if ( p->pPars->nConfLimit )
                            Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                        else if ( p->pPars->fVerbose )
                            Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                        p->pPars->iFrame = iFrame;
                        return -1;
                    }
                    if ( RetValue == 0 )
                    {
                        if ( fPrintClauses )
                        {
                            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                            Pdr_ManPrintClauses( p, 0 );
                        }
                        if ( p->pPars->fVerbose && !p->pPars->fUseAbs )
                            Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                        p->pPars->iFrame = iFrame;
                        if ( !p->pPars->fSolveAll )
                        {
                            abctime clk = Abc_Clock();
                            Abc_Cex_t * pCex = Pdr_ManDeriveCexAbs(p);
                            p->tAbs += Abc_Clock() - clk;
                            if ( pCex == NULL )
                            {
                                assert( p->pPars->fUseAbs );
                                Pdr_QueueClean( p );
                                pCube = NULL;
                                fRefined = 1;
                                break; // keep solving
                            }
                            p->pAig->pSeqModel = pCex;

                            if ( p->pPars->fVerbose && p->pPars->fUseAbs )
                                Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                            return 0; // SAT
                        }
                        p->pPars->nFailOuts++;
                        pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Pdr_ManDeriveCex(p) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                        if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                        assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                        Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                        {
                            if ( p->pPars->fVerbose )
                                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                            if ( !p->pPars->fSilent )
                                Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                            p->pPars->iFrame = iFrame;
                            return -1;
                        }
                        if ( !p->pPars->fNotVerbose )
                            Abc_Print( 1, "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n",
                                nOutDigits, p->iOutCur, iFrame, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                        if ( p->pPars->nFailOuts == Saig_ManPoNum(p->pAig) )
                            return 0; // all SAT
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );
                }
            }
            if ( fRefined )
                break;
            if ( p->pTime4Outs )
            {
                abctime timeSince = Abc_Clock() - clkOne;
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                p->pTime4Outs[p->iOutCur] = (p->pTime4Outs[p->iOutCur] > timeSince) ? p->pTime4Outs[p->iOutCur] - timeSince : 0;
                if ( p->pTime4Outs[p->iOutCur] == 0 && Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL ) // undecided
                {
                    p->pPars->nDropOuts++;
                    if ( p->pPars->vOutMap ) 
                        Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, -1 );
                    if ( !p->pPars->fNotVerbose ) 
                        Abc_Print( 1, "Timing out on output %*d in frame %d.\n", nOutDigits, p->iOutCur, iFrame );
                }
                p->timeToStopOne = 0;
            }
        }
        /*
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            int i, Used;
            Vec_IntForEachEntry( p->vAbsFlops, Used, i )
                if ( Used && (Vec_IntEntry(p->vPrio, i) >> p->nPrioShift) == 0 )
                    Vec_IntWriteEntry( p->vAbsFlops, i, 0 );
        }
        */
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            Pdr_Set_t * pSet;
            int i, j, k;
            Vec_IntFill( p->vAbsFlops, Vec_IntSize( p->vAbsFlops ), 0 );
            Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pSet, i, j )
                for ( k = 0; k < pSet->nLits; k++ )
                    Vec_IntWriteEntry( p->vAbsFlops, Abc_Lit2Var(pSet->Lits[k]), 1 );
        }

        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, !fRefined, Abc_Clock() - clkStart );
        if ( fRefined )
            continue;
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Finished frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        // open a new timeframe
        p->nQueLim = p->pPars->nRestLimit;
        assert( pCube == NULL );
        Pdr_ManSetPropertyOutput( p, iFrame );
        Pdr_ManCreateSolver( p, ++iFrame );
        if ( fPrintClauses )
        {
            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
            Pdr_ManPrintClauses( p, 0 );
        }
        // push clauses into this timeframe
        RetValue = Pdr_ManPushClauses( p );
        if ( RetValue == -1 )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
            {
                if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                    Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                else
                    Abc_Print( 1, "Reached conflict limit (%d) in frame.\n",  p->pPars->nConfLimit, iFrame );
            }
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( RetValue )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Pdr_ManReportInvariant( p );
            if ( !p->pPars->fSilent )
                Pdr_ManVerifyInvariant( p );
            p->pPars->iFrame = iFrame;
            // count the number of UNSAT outputs
            p->pPars->nProveOuts = Saig_ManPoNum(p->pAig) - p->pPars->nFailOuts - p->pPars->nDropOuts;
            // convert previously 'unknown' into 'unsat'
            if ( p->pPars->vOutMap )
                for ( iFrame = 0; iFrame < Saig_ManPoNum(p->pAig); iFrame++ )
                    if ( Vec_IntEntry(p->pPars->vOutMap, iFrame) == -2 ) // unknown
                    {
                        Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
                    }
            if ( p->pPars->nProveOuts == Saig_ManPoNum(p->pAig) )
                return 1; // UNSAT
            if ( p->pPars->nFailOuts > 0 )
                return 0; // SAT
            return -1;
        }
        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );

        // check termination
        if ( p->pPars->pFuncStop && p->pPars->pFuncStop(p->pPars->RunId) )
        {
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nFrameMax && iFrame >= p->pPars->nFrameMax )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached limit on the number of timeframes (%d).\n", p->pPars->nFrameMax );
            p->pPars->iFrame = iFrame;
            return -1;
        }
    }
    assert( 0 );
    return -1;
}